

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

char * TextReplace(char *text,char *replace,char *by)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  int local_50;
  int count;
  int lastReplacePos;
  int byLen;
  int replaceLen;
  char *temp;
  char *insertPoint;
  char *result;
  char *by_local;
  char *replace_local;
  char *text_local;
  
  if (((text == (char *)0x0) || (replace == (char *)0x0)) || (by == (char *)0x0)) {
    text_local = (char *)0x0;
  }
  else {
    uVar1 = TextLength(replace);
    if (uVar1 == 0) {
      text_local = (char *)0x0;
    }
    else {
      uVar2 = TextLength(by);
      local_50 = 0;
      temp = text;
      while (pcVar5 = strstr(temp,replace), pcVar5 != (char *)0x0) {
        temp = pcVar5 + (int)uVar1;
        local_50 = local_50 + 1;
      }
      uVar3 = TextLength(text);
      text_local = (char *)malloc((ulong)(uVar3 + (uVar2 - uVar1) * local_50 + 1));
      _byLen = text_local;
      replace_local = text;
      if (text_local == (char *)0x0) {
        text_local = (char *)0x0;
      }
      else {
        while (local_50 != 0) {
          pcVar5 = strstr(replace_local,replace);
          iVar4 = (int)pcVar5 - (int)replace_local;
          pcVar5 = strncpy(_byLen,replace_local,(long)iVar4);
          pcVar5 = strcpy(pcVar5 + iVar4,by);
          replace_local = replace_local + (int)(iVar4 + uVar1);
          local_50 = local_50 + -1;
          _byLen = pcVar5 + (int)uVar2;
        }
        strcpy(_byLen,replace_local);
      }
    }
  }
  return text_local;
}

Assistant:

char *TextReplace(char *text, const char *replace, const char *by)
{
    // Sanity checks and initialization
    if (!text || !replace || !by) return NULL;

    char *result;

    char *insertPoint;      // Next insert point
    char *temp;             // Temp pointer
    int replaceLen;         // Replace string length of (the string to remove)
    int byLen;              // Replacement length (the string to replace replace by)
    int lastReplacePos;     // Distance between replace and end of last replace
    int count;              // Number of replacements

    replaceLen = TextLength(replace);
    if (replaceLen == 0) return NULL;  // Empty replace causes infinite loop during count

    byLen = TextLength(by);

    // Count the number of replacements needed
    insertPoint = text;
    for (count = 0; (temp = strstr(insertPoint, replace)); count++) insertPoint = temp + replaceLen;

    // Allocate returning string and point temp to it
    temp = result = RL_MALLOC(TextLength(text) + (byLen - replaceLen)*count + 1);

    if (!result) return NULL;   // Memory could not be allocated

    // First time through the loop, all the variable are set correctly from here on,
    //    temp points to the end of the result string
    //    insertPoint points to the next occurrence of replace in text
    //    text points to the remainder of text after "end of replace"
    while (count--)
    {
        insertPoint = strstr(text, replace);
        lastReplacePos = (int)(insertPoint - text);
        temp = strncpy(temp, text, lastReplacePos) + lastReplacePos;
        temp = strcpy(temp, by) + byLen;
        text += lastReplacePos + replaceLen; // Move to next "end of replace"
    }

    // Copy remaind text part after replacement to result (pointed by moving temp)
    strcpy(temp, text);

    return result;
}